

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,320ul,16ul>>
::
unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>
          (locator *__return_storage_ptr__,void *this,size_t hash,try_emplace_args_t *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,ArgTokens *args_2)

{
  undefined1 auVar1 [16];
  byte bVar2;
  undefined1 auVar3 [16];
  byte bVar4;
  char *r;
  ulong uVar5;
  value_type_pointer ppVar6;
  locator *extraout_RAX;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long *plVar10;
  group_type_pointer __s;
  long lVar11;
  float fVar12;
  arrays_type new_arrays_;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff78;
  arrays_type local_68;
  locator local_48;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)((long)this + 0x30);
  auVar3._8_8_ = 0x41;
  auVar3._0_8_ = 0xc9714fbcda3ac11;
  lVar8 = *this;
  fVar12 = ceilf((float)((SUB168(auVar1 * auVar3,8) >> 6) + 1) / 0.875);
  uVar9 = (long)(fVar12 - 9.223372e+18) & (long)fVar12 >> 0x3f | (long)fVar12;
  uVar7 = uVar9 / 0xf;
  uVar5 = 0x40;
  if (uVar7 != 0) {
    uVar5 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar5 = uVar5 ^ 0x3f;
  }
  local_68.groups_size_index = 0x3f;
  if (0x1d < uVar9) {
    local_68.groups_size_index = uVar5;
  }
  bVar2 = (byte)local_68.groups_size_index;
  lVar11 = 1L << (-bVar2 & 0x3f);
  local_68.groups_size_mask = lVar11 - 1;
  local_68.groups_ = (group_type_pointer)0x0;
  local_68.elements_ = (value_type_pointer)0x0;
  if (uVar9 == 0) {
    local_68.groups_ =
         (group_type_pointer)
         &dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
          ::storage;
  }
  else {
    bVar4 = 0x40 - bVar2;
    uVar7 = ((0x268L << (bVar4 & 0x3f)) + 0xeU) / 5 & 0xfffffffffffffff8;
    uVar5 = uVar7 * 5 + 0xf & 0xfffffffffffffff0;
    ppVar6 = *(value_type_pointer *)(lVar8 + 0x140);
    plVar10 = (long *)(lVar8 + 0x140);
    if ((ulong)((long)plVar10 - (long)ppVar6) < uVar5) {
      ppVar6 = (value_type_pointer)operator_new(uVar7 * 5);
    }
    else {
      *plVar10 = (long)&(ppVar6->first)._M_len + uVar5;
    }
    lVar8 = 600L << (bVar4 & 0x3f);
    __s = (group_type_pointer)
          ((long)&ppVar6[-1].first._M_len +
          (ulong)(-((int)ppVar6 + (int)lVar8 + -0x28) & 0xf) + lVar8);
    local_68.groups_ = __s;
    local_68.elements_ = ppVar6;
    memset(__s,0,0x10L << (bVar4 & 0x3f));
    __s[lVar11 + -1].m[0xe].n = '\x01';
  }
  nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>
            (&local_48,&local_68,(arrays_type *)(hash >> (bVar2 & 0x3f)),hash,(size_t)args,
             (try_emplace_args_t *)args_1,in_stack_ffffffffffffff78,(ArgTokens *)args);
  __return_storage_ptr__->p = local_48.p;
  __return_storage_ptr__->pg = local_48.pg;
  __return_storage_ptr__->n = local_48.n;
  *(undefined4 *)&__return_storage_ptr__->field_0xc = local_48._12_4_;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
  ::unchecked_rehash((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                      *)this,&local_68);
  *(long *)((long)this + 0x30) = *(long *)((long)this + 0x30) + 1;
  return extraout_RAX;
}

Assistant:

BOOST_NOINLINE locator unchecked_emplace_with_rehash(std::size_t hash, Args&&... args) {
        auto new_arrays_ = new_arrays_for_growth();
        locator it;
        BOOST_TRY {
            /* strong exception guarantee -> try insertion before rehash */
            it = nosize_unchecked_emplace_at(new_arrays_, position_for(hash, new_arrays_), hash,
                                             std::forward<Args>(args)...);
        }